

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::fixup_io_block_patch_primitive_qualifiers
          (CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  bool bVar2;
  uint32_t id;
  TypedID<(diligent_spirv_cross::Types)1> TVar3;
  SPIRType *pSVar4;
  size_t sVar5;
  uint local_44;
  uint32_t i_1;
  uint local_34;
  uint32_t i;
  bool do_promote_decoration;
  Decoration promoted_decoration;
  uint32_t member_count;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSVar4 = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,id);
  bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)(pSVar4->super_IVariant).self.id,Block)
  ;
  if (bVar1) {
    sVar5 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::size
                      (&(pSVar4->member_types).
                        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                      );
    i = 0;
    bVar1 = false;
    for (local_34 = 0; local_34 < (uint)sVar5; local_34 = local_34 + 1) {
      TVar3 = TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar4->super_IVariant).self);
      bVar2 = Compiler::has_member_decoration
                        (&this->super_Compiler,(TypeID)TVar3.id,local_34,DecorationPatch);
      if (bVar2) {
        i = 0xf;
        bVar1 = true;
        break;
      }
      TVar3 = TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar4->super_IVariant).self);
      bVar2 = Compiler::has_member_decoration
                        (&this->super_Compiler,(TypeID)TVar3.id,local_34,DecorationPerPrimitiveEXT);
      if (bVar2) {
        i = 0x1497;
        bVar1 = true;
        break;
      }
    }
    if (bVar1) {
      Compiler::set_decoration(&this->super_Compiler,(ID)(var->super_IVariant).self.id,i,0);
      for (local_44 = 0; local_44 < (uint)sVar5; local_44 = local_44 + 1) {
        TVar3 = TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar4->super_IVariant).self);
        Compiler::unset_member_decoration(&this->super_Compiler,(TypeID)TVar3.id,local_44,i);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::fixup_io_block_patch_primitive_qualifiers(const SPIRVariable &var)
{
	// Works around weird behavior in glslangValidator where
	// a patch out block is translated to just block members getting the decoration.
	// To make glslang not complain when we compile again, we have to transform this back to a case where
	// the variable itself has Patch decoration, and not members.
	// Same for perprimitiveEXT.
	auto &type = get<SPIRType>(var.basetype);
	if (has_decoration(type.self, DecorationBlock))
	{
		uint32_t member_count = uint32_t(type.member_types.size());
		Decoration promoted_decoration = {};
		bool do_promote_decoration = false;
		for (uint32_t i = 0; i < member_count; i++)
		{
			if (has_member_decoration(type.self, i, DecorationPatch))
			{
				promoted_decoration = DecorationPatch;
				do_promote_decoration = true;
				break;
			}
			else if (has_member_decoration(type.self, i, DecorationPerPrimitiveEXT))
			{
				promoted_decoration = DecorationPerPrimitiveEXT;
				do_promote_decoration = true;
				break;
			}
		}

		if (do_promote_decoration)
		{
			set_decoration(var.self, promoted_decoration);
			for (uint32_t i = 0; i < member_count; i++)
				unset_member_decoration(type.self, i, promoted_decoration);
		}
	}
}